

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdGenerateMipmap2D
          (CommandBuffer *this,Ptr<ImageBase> *image,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage,VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask
          ,VkImageLayout old_layout,VkImageLayout new_layout)

{
  initializer_list<VkImageSubresourceLayers> __l;
  initializer_list<VkImageSubresourceLayers> __l_00;
  initializer_list<VkImageSubresourceLayers> __l_01;
  initializer_list<VkImageSubresourceLayers> __l_02;
  initializer_list<VkImageSubresourceLayers> __l_03;
  uint uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  VkExtent3D *pVVar4;
  uint32_t *puVar5;
  VkImageLayout in_ECX;
  VkImageLayout in_R8D;
  VkImageBlit blit;
  uint32_t i;
  int32_t mip_height;
  int32_t mip_width;
  VkImageSubresourceLayers subresource;
  undefined4 in_stack_fffffffffffffb40;
  VkImageLayout in_stack_fffffffffffffb44;
  undefined8 in_stack_fffffffffffffb50;
  VkImageBlit *in_stack_fffffffffffffb58;
  element_type *in_stack_fffffffffffffb60;
  Ptr<ImageBase> *in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb70;
  VkImageLayout in_stack_fffffffffffffb74;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffb78;
  vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
  *in_stack_fffffffffffffb80;
  VkPipelineStageFlags in_stack_fffffffffffffb88;
  VkPipelineStageFlags in_stack_fffffffffffffb8c;
  element_type *in_stack_fffffffffffffb90;
  VkImageLayout in_stack_fffffffffffffba0;
  uint32_t uVar6;
  undefined8 in_stack_fffffffffffffba8;
  uint32_t uVar7;
  undefined8 in_stack_fffffffffffffbb0;
  undefined1 local_3b9 [17];
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  allocator<VkImageSubresourceLayers> local_329;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *local_2d8;
  vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *pvStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  allocator<VkImageSubresourceLayers> local_299;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  allocator<VkImageSubresourceLayers> local_209;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  uint32_t local_178;
  uint32_t uStack_174;
  uint32_t local_170;
  undefined4 local_16c;
  undefined4 uStack_168;
  undefined4 local_164;
  int local_160;
  int local_15c [3];
  uint32_t local_150;
  uint32_t uStack_14c;
  uint32_t local_148;
  undefined4 local_144;
  undefined4 uStack_140;
  undefined4 local_13c;
  undefined4 local_138;
  int iStack_134;
  undefined4 uStack_130;
  uint32_t uStack_12c;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_11c;
  uint32_t local_114;
  undefined4 local_110;
  uint uStack_10c;
  undefined4 uStack_108;
  uint32_t uStack_104;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f4;
  uint32_t local_ec;
  uint local_e8;
  uint32_t local_e4;
  uint32_t local_e0;
  allocator<VkImageSubresourceLayers> local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  VkImageLayout local_1c;
  VkImageLayout local_18;
  
  local_1c = in_R8D;
  local_18 = in_ECX;
  peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ada30);
  uVar2 = ImageBase::GetMipLevels(peVar3);
  uVar7 = (uint32_t)in_stack_fffffffffffffbb0;
  uVar6 = (uint32_t)in_stack_fffffffffffffba8;
  if (uVar2 == 1) {
    local_38 = 1;
    uStack_30 = 0;
    peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ada82);
    uVar2 = ImageBase::GetArrayLayers(peVar3);
    uStack_30 = CONCAT44(uVar2,(undefined4)uStack_30);
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x2adad6);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x2adaff);
    std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2adb0c);
    local_c8 = local_38;
    uStack_c0 = uStack_30;
    local_b8 = &local_c8;
    local_b0 = 1;
    std::allocator<VkImageSubresourceLayers>::allocator
              ((allocator<VkImageSubresourceLayers> *)0x2adb55);
    __l._M_len._0_4_ = in_stack_fffffffffffffb70;
    __l._M_array = (iterator)in_stack_fffffffffffffb68;
    __l._M_len._4_4_ = in_stack_fffffffffffffb74;
    std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
              ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
               in_stack_fffffffffffffb60,__l,(allocator_type *)in_stack_fffffffffffffb58);
    ImageBase::GetMemoryBarriers
              ((ImageBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               in_stack_fffffffffffffb80,(VkAccessFlags)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               (VkAccessFlags)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
               in_stack_fffffffffffffba0,uVar6,uVar7);
    CmdPipelineBarrier((CommandBuffer *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                       in_stack_fffffffffffffb88,
                       (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                       in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                       (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                       CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::~vector
              ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::allocator<VkImageSubresourceLayers>::~allocator(&local_c9);
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  }
  else {
    peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2adcda);
    pVVar4 = ImageBase::GetExtent(peVar3);
    local_e0 = pVVar4->width;
    peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2adcf8);
    pVVar4 = ImageBase::GetExtent(peVar3);
    local_e4 = pVVar4->height;
    local_e8 = 1;
    while( true ) {
      uVar1 = local_e8;
      uVar7 = (uint32_t)in_stack_fffffffffffffbb0;
      uVar6 = (uint32_t)in_stack_fffffffffffffba8;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2add30);
      uVar2 = ImageBase::GetMipLevels(peVar3);
      if (uVar2 <= uVar1) break;
      memset(&local_138,0,0x50);
      local_144 = 0;
      uStack_140 = 0;
      local_13c = 0;
      local_128 = 0;
      local_120 = 0;
      local_150 = local_e0;
      uStack_14c = local_e4;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2addc5);
      pVVar4 = ImageBase::GetExtent(peVar3);
      local_148 = pVVar4->depth;
      local_11c = CONCAT44(uStack_14c,local_150);
      local_138 = 1;
      iStack_134 = local_e8 - 1;
      uStack_130 = 0;
      local_114 = local_148;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ade29);
      uStack_12c = ImageBase::GetArrayLayers(peVar3);
      local_15c[2] = (int)local_e0 / 2;
      local_15c[1] = 1;
      puVar5 = (uint32_t *)std::max<int>(local_15c + 2,local_15c + 1);
      local_e0 = *puVar5;
      local_15c[0] = (int)local_e4 / 2;
      local_160 = 1;
      puVar5 = (uint32_t *)std::max<int>(local_15c,&local_160);
      uStack_174 = *puVar5;
      local_16c = 0;
      uStack_168 = 0;
      local_164 = 0;
      local_100 = 0;
      local_f8 = 0;
      local_178 = local_e0;
      local_e4 = uStack_174;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2adf1e);
      pVVar4 = ImageBase::GetExtent(peVar3);
      local_170 = pVVar4->depth;
      local_f4 = CONCAT44(uStack_174,local_178);
      local_110 = 1;
      uStack_10c = local_e8;
      uStack_108 = 0;
      local_ec = local_170;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2adf7f);
      uStack_104 = ImageBase::GetArrayLayers(peVar3);
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x2adff0);
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = 0;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x2ae019);
      std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2ae026);
      local_208 = CONCAT44(iStack_134,local_138);
      uStack_200 = CONCAT44(uStack_12c,uStack_130);
      local_1f8 = &local_208;
      local_1f0 = 1;
      std::allocator<VkImageSubresourceLayers>::allocator
                ((allocator<VkImageSubresourceLayers> *)0x2ae06f);
      __l_00._M_len._0_4_ = in_stack_fffffffffffffb70;
      __l_00._M_array = (iterator)in_stack_fffffffffffffb68;
      __l_00._M_len._4_4_ = in_stack_fffffffffffffb74;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 in_stack_fffffffffffffb60,__l_00,(allocator_type *)in_stack_fffffffffffffb58);
      ImageBase::GetMemoryBarriers
                ((ImageBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,(VkAccessFlags)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                 in_stack_fffffffffffffba0,uVar6,uVar7);
      CmdPipelineBarrier((CommandBuffer *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                         in_stack_fffffffffffffb88,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::~vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::allocator<VkImageSubresourceLayers>::~allocator(&local_209);
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      in_stack_fffffffffffffba8 = 0;
      in_stack_fffffffffffffbb0 = 0;
      local_228 = 0;
      uStack_220 = 0;
      local_218 = 0;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x2ae212);
      local_238 = 0;
      local_248 = in_stack_fffffffffffffba8;
      uStack_240 = in_stack_fffffffffffffbb0;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x2ae23b);
      std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2ae248);
      local_298 = CONCAT44(uStack_10c,local_110);
      uStack_290 = CONCAT44(uStack_104,uStack_108);
      local_288 = &local_298;
      local_280 = 1;
      std::allocator<VkImageSubresourceLayers>::allocator
                ((allocator<VkImageSubresourceLayers> *)0x2ae291);
      __l_01._M_len._0_4_ = in_stack_fffffffffffffb70;
      __l_01._M_array = (iterator)in_stack_fffffffffffffb68;
      __l_01._M_len._4_4_ = in_stack_fffffffffffffb74;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 in_stack_fffffffffffffb60,__l_01,(allocator_type *)in_stack_fffffffffffffb58);
      in_stack_fffffffffffffba0 = local_1c;
      if (local_e8 != 1) {
        in_stack_fffffffffffffba0 = VK_IMAGE_LAYOUT_UNDEFINED;
      }
      ImageBase::GetMemoryBarriers
                ((ImageBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,(VkAccessFlags)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                 in_stack_fffffffffffffba0,(uint32_t)in_stack_fffffffffffffba8,
                 (uint32_t)in_stack_fffffffffffffbb0);
      CmdPipelineBarrier((CommandBuffer *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                         in_stack_fffffffffffffb88,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::~vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::allocator<VkImageSubresourceLayers>::~allocator(&local_299);
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      CmdBlitImage((CommandBuffer *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   in_stack_fffffffffffffb68,(Ptr<ImageBase> *)in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb58,(VkFilter)((ulong)in_stack_fffffffffffffb50 >> 0x20));
      in_stack_fffffffffffffb78 =
           (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x0;
      in_stack_fffffffffffffb80 =
           (vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)0x0;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2a8 = 0;
      in_stack_fffffffffffffb74 = local_18;
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x2ae3e5);
      local_2c8 = 0;
      local_2d8 = in_stack_fffffffffffffb78;
      pvStack_2d0 = in_stack_fffffffffffffb80;
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x2ae40b);
      in_stack_fffffffffffffb90 =
           std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ae418);
      local_328 = CONCAT44(iStack_134,local_138);
      uStack_320 = CONCAT44(uStack_12c,uStack_130);
      local_318 = &local_328;
      local_310 = 1;
      std::allocator<VkImageSubresourceLayers>::allocator
                ((allocator<VkImageSubresourceLayers> *)0x2ae45b);
      __l_02._M_len._0_4_ = in_stack_fffffffffffffb70;
      __l_02._M_array = (iterator)in_stack_fffffffffffffb68;
      __l_02._M_len._4_4_ = in_stack_fffffffffffffb74;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 in_stack_fffffffffffffb60,__l_02,(allocator_type *)in_stack_fffffffffffffb58);
      ImageBase::GetMemoryBarriers
                ((ImageBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,(VkAccessFlags)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                 ,(VkAccessFlags)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                 in_stack_fffffffffffffba0,(uint32_t)in_stack_fffffffffffffba8,
                 (uint32_t)in_stack_fffffffffffffbb0);
      CmdPipelineBarrier((CommandBuffer *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                         in_stack_fffffffffffffb88,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::~vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::allocator<VkImageSubresourceLayers>::~allocator(&local_329);
      std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      in_stack_fffffffffffffb70 = local_e8;
      peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ae54e);
      uVar2 = ImageBase::GetMipLevels(peVar3);
      if (in_stack_fffffffffffffb70 == uVar2 - 1) {
        in_stack_fffffffffffffb50 = 0;
        local_348 = 0;
        uStack_340 = 0;
        local_338 = 0;
        in_stack_fffffffffffffb44 = local_18;
        std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
                  ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x2ae59b);
        local_368 = 0;
        local_358 = 0;
        uStack_360 = in_stack_fffffffffffffb50;
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
                  ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x2ae5c1
                  );
        in_stack_fffffffffffffb60 =
             std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ae5ce);
        local_3b9._5_4_ = uStack_10c;
        local_3b9._1_4_ = local_110;
        local_3b9._9_8_ = CONCAT44(uStack_104,uStack_108);
        local_3a8 = local_3b9 + 1;
        local_3a0 = 1;
        in_stack_fffffffffffffb68 = (Ptr<ImageBase> *)local_3b9;
        std::allocator<VkImageSubresourceLayers>::allocator
                  ((allocator<VkImageSubresourceLayers> *)0x2ae611);
        __l_03._M_len._0_4_ = in_stack_fffffffffffffb70;
        __l_03._M_array = (iterator)in_stack_fffffffffffffb68;
        __l_03._M_len._4_4_ = in_stack_fffffffffffffb74;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                   in_stack_fffffffffffffb60,__l_03,(allocator_type *)in_stack_fffffffffffffb58);
        ImageBase::GetMemoryBarriers
                  ((ImageBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   in_stack_fffffffffffffb80,
                   (VkAccessFlags)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                   (VkAccessFlags)in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                   in_stack_fffffffffffffba0,(uint32_t)in_stack_fffffffffffffba8,
                   (uint32_t)in_stack_fffffffffffffbb0);
        CmdPipelineBarrier((CommandBuffer *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                           in_stack_fffffffffffffb88,
                           (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                           in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                           (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
                  ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::~vector
                  ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        std::allocator<VkImageSubresourceLayers>::~allocator
                  ((allocator<VkImageSubresourceLayers> *)local_3b9);
        std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
                  ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
                  ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      }
      local_e8 = local_e8 + 1;
    }
  }
  return;
}

Assistant:

void CommandBuffer::CmdGenerateMipmap2D(const Ptr<ImageBase> &image, VkPipelineStageFlags src_stage,
                                        VkPipelineStageFlags dst_stage, VkAccessFlags src_access_mask,
                                        VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                        VkImageLayout new_layout) const {
	if (image->GetMipLevels() == 1) {
		VkImageSubresourceLayers subresource = {};
		subresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		subresource.mipLevel = 0;
		subresource.baseArrayLayer = 0;
		subresource.layerCount = image->GetArrayLayers();
		CmdPipelineBarrier(
		    src_stage, dst_stage, {}, {},
		    image->GetMemoryBarriers({subresource}, src_access_mask, dst_access_mask, old_layout, new_layout));
		return;
	}
	auto mip_width = (int32_t)image->GetExtent().width, mip_height = (int32_t)image->GetExtent().height;
	for (uint32_t i = 1; i < image->GetMipLevels(); ++i) {
		VkImageBlit blit{};
		blit.srcOffsets[0] = {0, 0, 0};
		blit.srcOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.srcSubresource.mipLevel = i - 1;
		blit.srcSubresource.baseArrayLayer = 0;
		blit.srcSubresource.layerCount = image->GetArrayLayers();
		mip_width = std::max(mip_width / 2, 1);
		mip_height = std::max(mip_height / 2, 1);
		blit.dstOffsets[0] = {0, 0, 0};
		blit.dstOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.dstSubresource.mipLevel = i;
		blit.dstSubresource.baseArrayLayer = 0;
		blit.dstSubresource.layerCount = image->GetArrayLayers();

		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers(
		                       {blit.srcSubresource}, i == 1 ? src_access_mask : VK_ACCESS_TRANSFER_WRITE_BIT,
		                       VK_ACCESS_TRANSFER_READ_BIT, i == 1 ? old_layout : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		                       VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL));
		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers({blit.dstSubresource}, i == 1 ? src_access_mask : 0,
		                                            VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
		                                            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL));

		CmdBlitImage(image, image, blit, VK_FILTER_LINEAR);

		CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
		                   image->GetMemoryBarriers({blit.srcSubresource}, 0, dst_access_mask,
		                                            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, new_layout));
		if (i == image->GetMipLevels() - 1) {
			CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
			                   image->GetMemoryBarriers({blit.dstSubresource}, VK_ACCESS_TRANSFER_WRITE_BIT,
			                                            dst_access_mask, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			                                            new_layout));
		}
	}
}